

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int fits_encode_url(char *inpath,int maxlength,char *outpath,int *status)

{
  byte bVar1;
  char acStack_d8 [40];
  uchar isAcceptable [96];
  int iout;
  char *hex;
  char *q;
  char *p;
  uchar a;
  int *status_local;
  char *outpath_local;
  int maxlength_local;
  char *inpath_local;
  
  isAcceptable[0x5c] = '\0';
  isAcceptable[0x5d] = '\0';
  isAcceptable[0x5e] = '\0';
  isAcceptable[0x5f] = '\0';
  memcpy(acStack_d8 + 0x20,&DAT_00299a60,0x60);
  hex = outpath;
  q = inpath;
  if (*status == 0) {
    for (; *q != '\0' && (int)isAcceptable._92_4_ < maxlength + -1; q = q + 1) {
      bVar1 = *q;
      if (((bVar1 < 0x20) || (0x7f < bVar1)) ||
         (acStack_d8[(long)(int)(bVar1 - 0x20) + 0x20] == '\0')) {
        if (maxlength + -1 <= isAcceptable._92_4_ + 2) {
          ffpmsg("URL input is too long to encode (fits_encode_url)");
          *status = 0x7d;
          *outpath = '\0';
          return *status;
        }
        *hex = '%';
        hex[1] = "0123456789ABCDEF"[(int)(uint)bVar1 >> 4];
        hex[2] = "0123456789ABCDEF"[(int)(bVar1 & 0xf)];
        isAcceptable._92_4_ = isAcceptable._92_4_ + 3;
        hex = hex + 3;
      }
      else {
        *hex = *q;
        isAcceptable._92_4_ = isAcceptable._92_4_ + 1;
        hex = hex + 1;
      }
    }
    if ((*q == '\0') || (isAcceptable._92_4_ != maxlength + -1)) {
      *hex = '\0';
      inpath_local._4_4_ = *status;
    }
    else {
      ffpmsg("URL input is too long to encode (fits_encode_url)");
      *status = 0x7d;
      *outpath = '\0';
      inpath_local._4_4_ = *status;
    }
  }
  else {
    inpath_local._4_4_ = *status;
  }
  return inpath_local._4_4_;
}

Assistant:

int fits_encode_url(char *inpath,  /* I URL  to be encoded                  */
                    int maxlength, /* I max number of chars that may be copied
                               to outpath, including terminating NULL. */ 
		    char *outpath, /* O output encoded URL                  */
		    int *status)
     /*
       encode all URL "unsafe" and "reserved" characters using the "%XX"
       convention, where XX stand for the two hexidecimal digits of the
       encode character's ASCII code.

       Note that the outpath length, as specified by the maxlength argument,
       should be at least as large as inpath and preferably larger (to hold
       any characters that need encoding).  If more than maxlength chars are 
       required for outpath, including the terminating NULL, outpath will
       be set to size 0 and an error status will be returned.
       
       This function was adopted from code in the libwww.a library available
       via the W3 consortium <URL: http://www.w3.org>
     */
{
  unsigned char a;
  
  char *p;
  char *q;
  char *hex = "0123456789ABCDEF";
  int iout=0;
  
unsigned const char isAcceptable[96] =
{/* 0x0 0x1 0x2 0x3 0x4 0x5 0x6 0x7 0x8 0x9 0xA 0xB 0xC 0xD 0xE 0xF */
  
    0x0,0x0,0x0,0x0,0x0,0x0,0x0,0x0,0x0,0x0,0xF,0xE,0x0,0xF,0xF,0xC, 
                                           /* 2x  !"#$%&'()*+,-./   */
    0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0x8,0x0,0x0,0x0,0x0,0x0,
                                           /* 3x 0123456789:;<=>?   */
    0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF, 
                                           /* 4x @ABCDEFGHIJKLMNO   */
    0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0x0,0x0,0x0,0x0,0xF,
                                           /* 5X PQRSTUVWXYZ[\]^_   */
    0x0,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,
                                           /* 6x `abcdefghijklmno   */
    0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0x0,0x0,0x0,0x0,0x0  
                                           /* 7X pqrstuvwxyz{\}~DEL */
};

  if(*status != 0) return(*status);
  
  /* loop over all characters in inpath until '\0' is encountered */

  for(q = outpath, p = inpath; *p && (iout < maxlength-1) ; p++)
    {
      a = (unsigned char)*p;

      /* if the charcter requires encoding then process it */

      if(!( a>=32 && a<128 && (isAcceptable[a-32])))
	{
           if (iout+2 < maxlength-1)
           {
	     /* add a '%' character to the outpath */
	     *q++ = HEX_ESCAPE;
	     /* add the most significant ASCII code hex value */
	     *q++ = hex[a >> 4];
	     /* add the least significant ASCII code hex value */
	     *q++ = hex[a & 15];
             iout += 3;
           }
           else
           {
              ffpmsg("URL input is too long to encode (fits_encode_url)");
              *status = URL_PARSE_ERROR;
              outpath[0] = 0;
              return (*status);
           }
	}
      /* else just copy the character as is */
      else 
      {
         *q++ = *p;
         iout++;
      }
    }

  /* null terminate the outpath string */

  if (*p && (iout == maxlength-1))
  {
     ffpmsg("URL input is too long to encode (fits_encode_url)");
     *status = URL_PARSE_ERROR;
     outpath[0] = 0;
     return (*status);
  }
  *q++ = 0; 
  
  return(*status);
}